

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O1

void __thiscall
breakpoint_recorder::replace_pending(breakpoint_recorder *this,string *name,var *function)

{
  proxy *ppVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  callable *this_00;
  function *pfVar4;
  anon_union_8_1_a8a14541_for_iterator_1 aVar5;
  iterator iVar6;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_21;
  
  sVar3 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
                      *)&this->m_pending,name);
  if (sVar3 != 0) {
    this_00 = cs_impl::any::const_val<cs::callable>(function);
    pfVar4 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs::function>(&this_00->mFunc);
    pfVar4->mMatch = true;
    sVar3 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()(&local_21,name);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar3;
    iVar6 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
            ::find<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
                        *)&this->m_pending,name,
                       SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                       SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0));
    aVar5 = iVar6.field_1;
    if (*(char *)((long)aVar5.slot_ + 0x28) == '\x01') {
      do {
        this = *(breakpoint_recorder **)&this->m_breakpoints;
        if (this == (breakpoint_recorder *)0x0) {
          return;
        }
      } while (*(long *)&(this->m_pending).
                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
               != *(long *)((long)aVar5.slot_ + 0x20));
      (**(code **)(**(long **)&this[1].m_breakpoints + 0x10))();
      *(undefined ***)((long)&this->m_pending + 8) = &PTR_get_type_0025da68;
      ppVar1 = function->mDat;
      if (ppVar1 != (proxy *)0x0) {
        ppVar1->refcount = ppVar1->refcount + 1;
      }
      *(proxy **)((long)&this->m_pending + 0x10) = ppVar1;
      *(undefined1 *)((long)aVar5.slot_ + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void replace_pending(const std::string &name, const cs::var &function)
	{
		if (m_pending.count(name) > 0) {
			const cs::callable::function_type &target = function.const_val<cs::callable>().get_raw_data();
			target.target<cs::function>()->set_debugger_state(true);
			auto key = m_pending.find(name);
			if (key->second.second) {
				for (auto &it: m_breakpoints) {
					if (it.id == key->second.first) {
						it.data.emplace<cs::var>(function);
						key->second.second = false;
						break;
					}
				}
			}
		}
	}